

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int removeFromSharingList(BtShared *pBt)

{
  sqlite3_mutex *p;
  bool bVar1;
  int local_24;
  BtShared *pBStack_20;
  int removed;
  BtShared *pList;
  sqlite3_mutex *pMaster;
  BtShared *pBt_local;
  
  local_24 = 0;
  p = sqlite3MutexAlloc(2);
  sqlite3_mutex_enter(p);
  pBt->nRef = pBt->nRef + -1;
  if (pBt->nRef < 1) {
    if (sqlite3SharedCacheList == pBt) {
      sqlite3SharedCacheList = pBt->pNext;
    }
    else {
      pBStack_20 = sqlite3SharedCacheList;
      while( true ) {
        bVar1 = false;
        if (pBStack_20 != (BtShared *)0x0) {
          bVar1 = pBStack_20->pNext != pBt;
        }
        if (!bVar1) break;
        pBStack_20 = pBStack_20->pNext;
      }
      if (pBStack_20 != (BtShared *)0x0) {
        pBStack_20->pNext = pBt->pNext;
      }
    }
    sqlite3_mutex_free(pBt->mutex);
    local_24 = 1;
  }
  sqlite3_mutex_leave(p);
  return local_24;
}

Assistant:

static int removeFromSharingList(BtShared *pBt){
#ifndef SQLITE_OMIT_SHARED_CACHE
  MUTEX_LOGIC( sqlite3_mutex *pMaster; )
  BtShared *pList;
  int removed = 0;

  assert( sqlite3_mutex_notheld(pBt->mutex) );
  MUTEX_LOGIC( pMaster = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER); )
  sqlite3_mutex_enter(pMaster);
  pBt->nRef--;
  if( pBt->nRef<=0 ){
    if( GLOBAL(BtShared*,sqlite3SharedCacheList)==pBt ){
      GLOBAL(BtShared*,sqlite3SharedCacheList) = pBt->pNext;
    }else{
      pList = GLOBAL(BtShared*,sqlite3SharedCacheList);
      while( ALWAYS(pList) && pList->pNext!=pBt ){
        pList=pList->pNext;
      }
      if( ALWAYS(pList) ){
        pList->pNext = pBt->pNext;
      }
    }
    if( SQLITE_THREADSAFE ){
      sqlite3_mutex_free(pBt->mutex);
    }
    removed = 1;
  }
  sqlite3_mutex_leave(pMaster);
  return removed;
#else
  return 1;
#endif
}